

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,
          Var originalInstance,uint32 index,Var *value,ScriptContext *requestContext)

{
  Var aValue;
  bool bVar1;
  BOOL BVar2;
  BOOL BVar3;
  RecyclableObject *pRVar4;
  int local_40;
  uint32 local_3c;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  BVar2 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,value);
  BVar3 = 1;
  if (BVar2 == 0) {
    local_3c = index;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_3c,
                       (IndexPropertyDescriptor **)&i,&local_40);
    if ((bVar1) && ((_i->Attributes & 8) == 0)) {
      aValue = (_i->Getter).ptr;
      if (aValue == (Var)0x0) {
        pRVar4 = ScriptContext::GetMissingItemResult(requestContext);
      }
      else {
        pRVar4 = VarTo<Js::RecyclableObject>(aValue);
        pRVar4 = (RecyclableObject *)
                 JavascriptOperators::CallGetter(pRVar4,originalInstance,requestContext);
      }
      BVar3 = 1;
    }
    else {
      pRVar4 = ScriptContext::GetMissingItemResult(requestContext);
      BVar3 = 0;
    }
    *value = pRVar4;
  }
  return BVar3;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItem(ES5Array* arr, DynamicObject* instance, Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        if (arr->DirectGetItemAt<Var>(index, value))
        {
            return true;
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                *value = requestContext->GetMissingItemResult();
                return false;
            }

            if (descriptor->Getter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Getter);
                *value = Js::JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            }
            else
            {
                *value = requestContext->GetMissingItemResult();
            }
            return true;
        }

        *value = requestContext->GetMissingItemResult();
        return false;
    }